

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_20069f2::MultiADescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,MultiADescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *keys,Span<const_CScript> param_2,
          FlatSigningProvider *param_3)

{
  long lVar1;
  pointer pCVar2;
  CScript *pCVar3;
  size_t i;
  ulong uVar4;
  CPubKey *key;
  pointer __args;
  long lVar5;
  vector<CPubKey,_std::allocator<CPubKey>_> *__range2;
  long in_FS_OFFSET;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> xkeys;
  CScript ret;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ret.super_CScriptBase._union._16_8_ = 0;
  ret.super_CScriptBase._24_8_ = 0;
  ret.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  ret.super_CScriptBase._union._8_8_ = 0;
  xkeys.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  xkeys.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  xkeys.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::reserve
            (&xkeys,((long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                          super__Vector_impl_data._M_start) / 0x41);
  pCVar2 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__args = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                super__Vector_impl_data._M_start; __args != pCVar2; __args = __args + 1) {
    std::vector<XOnlyPubKey,std::allocator<XOnlyPubKey>>::emplace_back<CPubKey_const&>
              ((vector<XOnlyPubKey,std::allocator<XOnlyPubKey>> *)&xkeys,__args);
  }
  if (this->m_sorted != false) {
    std::
    __sort<__gnu_cxx::__normal_iterator<XOnlyPubKey*,std::vector<XOnlyPubKey,std::allocator<XOnlyPubKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (xkeys.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
               super__Vector_impl_data._M_start,
               xkeys.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  ToByteVector<XOnlyPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
             xkeys.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
             super__Vector_impl_data._M_start);
  pCVar3 = CScript::operator<<(&ret,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &local_90);
  CScript::operator<<(pCVar3,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
  lVar5 = 0x20;
  for (uVar4 = 1;
      uVar4 < (ulong)(((long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                            super__Vector_impl_data._M_start) / 0x41); uVar4 = uVar4 + 1) {
    ToByteVector<XOnlyPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
               (XOnlyPubKey *)
               (((xkeys.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_keydata).super_base_blob<256U>.m_data.
                _M_elems + lVar5));
    pCVar3 = CScript::operator<<(&ret,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &local_90);
    CScript::operator<<(pCVar3,OP_CHECKSIGADD);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
    lVar5 = lVar5 + 0x20;
  }
  pCVar3 = CScript::push_int64(&ret,(long)this->m_threshold);
  CScript::operator<<(pCVar3,OP_NUMEQUAL);
  Vector<CScript>(__return_storage_ptr__,&ret);
  std::_Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::~_Vector_base
            (&xkeys.super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&ret.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider&) const override {
        CScript ret;
        std::vector<XOnlyPubKey> xkeys;
        xkeys.reserve(keys.size());
        for (const auto& key : keys) xkeys.emplace_back(key);
        if (m_sorted) std::sort(xkeys.begin(), xkeys.end());
        ret << ToByteVector(xkeys[0]) << OP_CHECKSIG;
        for (size_t i = 1; i < keys.size(); ++i) {
            ret << ToByteVector(xkeys[i]) << OP_CHECKSIGADD;
        }
        ret << m_threshold << OP_NUMEQUAL;
        return Vector(std::move(ret));
    }